

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantInnerTriangleSetTestInstance::
compare(InvariantInnerTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int param_3)

{
  float *pfVar1;
  _Rb_tree_header *p_Var2;
  ostringstream *poVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  TessPrimitiveType TVar7;
  TestLog *pTVar8;
  pointer pPVar9;
  PerPrimitiveVec *pPVar10;
  _Link_type p_Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  ulong uVar14;
  long *plVar15;
  long *plVar16;
  _Rb_tree_header *p_Var17;
  Vector<tcu::Vector<float,_3>,_3> *b;
  Vector<tcu::Vector<float,_3>,_3> *b_00;
  char cVar18;
  _Link_type p_Var19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  ulong local_250;
  ulong local_248;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *local_240;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_218;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e8;
  undefined1 local_1b8 [16];
  float local_1a8;
  float fStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  float local_198;
  undefined1 local_194 [84];
  ios_base local_140 [272];
  
  TVar7 = (this->super_InvarianceTestInstance).m_caseDef.primitiveType;
  p_Var19 = (_Link_type)primitivesA;
  if (TVar7 == TESSPRIMITIVETYPE_QUADS) {
    pTVar8 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    local_248 = (long)(primitivesA->
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(primitivesA->
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    local_250 = (long)(primitivesB->
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(primitivesB->
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e8._M_t._M_impl._0_1_ = 0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_218._M_t._M_impl.super__Rb_tree_header._M_header;
    local_218._M_t._M_impl._0_1_ = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar23 = true;
    do {
      bVar25 = bVar23;
      uVar21 = local_250;
      if (bVar25) {
        uVar21 = local_248;
      }
      local_240 = &local_218;
      if (bVar25) {
        local_240 = &local_1e8;
      }
      uVar22 = (uint)(uVar21 >> 6);
      if (0 < (int)uVar22) {
        uVar21 = 0;
        do {
          pPVar10 = primitivesB;
          if (bVar25) {
            pPVar10 = primitivesA;
          }
          pPVar9 = (pPVar10->
                   super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)(pPVar9[uVar21].tessCoord[0].m_data + 1);
          pfVar1 = pPVar9[uVar21].tessCoord[1].m_data + 1;
          uVar6 = *(undefined8 *)pPVar9[uVar21].tessCoord[2].m_data;
          local_1b8._4_4_ = (int)uVar5;
          local_1b8._0_4_ = pPVar9[uVar21].tessCoord[0].m_data[0];
          local_1b8._8_4_ = (int)((ulong)uVar5 >> 0x20);
          local_1b8._12_4_ = pPVar9[uVar21].tessCoord[1].m_data[0];
          local_1a8 = *pfVar1;
          fStack_1a4 = pfVar1[1];
          uStack_1a0 = (int)uVar6;
          uStack_19c = (int)((ulong)uVar6 >> 0x20);
          local_198 = pPVar9[uVar21].tessCoord[2].m_data[2];
          uVar14 = 0;
          bVar23 = false;
          do {
            p_Var19 = (_Link_type)CONCAT71((int7)((ulong)p_Var19 >> 8),1);
            lVar20 = 0;
            do {
              fVar4 = *(float *)(local_1b8 + lVar20 * 4 + uVar14 * 0xc);
              if (((fVar4 == 0.0) && (!NAN(fVar4))) || ((fVar4 == 1.0 && (!NAN(fVar4))))) {
                if (bVar23) goto LAB_00777f93;
                goto LAB_00777fc3;
              }
              lVar20 = 1;
              cVar18 = (char)p_Var19;
              p_Var19 = (_Link_type)0x0;
            } while (cVar18 != '\0');
            bVar23 = 1 < uVar14;
            uVar14 = uVar14 + 1;
          } while (uVar14 != 3);
LAB_00777f93:
          p_Var19 = (_Link_type)local_1b8;
          std::
          __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
                    (p_Var19,local_1b8 + 0x24);
          std::
          set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
          ::insert(local_240,(value_type *)p_Var19);
LAB_00777fc3:
          uVar21 = uVar21 + 1;
        } while (uVar21 != (uVar22 & 0x7fffffff));
      }
      bVar23 = false;
    } while (bVar25);
    p_Var2 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
    bVar23 = true;
    p_Var12 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_218._M_t._M_impl.super__Rb_tree_header ||
        (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2)
    {
      do {
        p_Var17 = &local_218._M_t._M_impl.super__Rb_tree_header;
        bVar24 = (_Rb_tree_header *)p_Var13 == p_Var17;
        bVar25 = (_Rb_tree_header *)p_Var12 == p_Var2;
        if ((bVar25) || ((_Rb_tree_header *)p_Var13 == p_Var17)) {
LAB_00778100:
          poVar3 = (ostringstream *)(local_1b8 + 8);
          local_1b8._0_8_ = pTVar8;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,
                     "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                     ,0x5a);
          local_238 = &local_228;
          local_230 = 0;
          local_228 = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_238);
          local_290 = &local_280;
          plVar16 = plVar15 + 2;
          if ((long *)*plVar15 == plVar16) {
            local_280 = *plVar16;
            lStack_278 = plVar15[3];
          }
          else {
            local_280 = *plVar16;
            local_290 = (long *)*plVar15;
          }
          local_288 = plVar15[1];
          *plVar15 = (long)plVar16;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_290);
          plVar16 = plVar15 + 2;
          if ((long *)*plVar15 == plVar16) {
            local_260 = *plVar16;
            lStack_258 = plVar15[3];
            local_270 = &local_260;
          }
          else {
            local_260 = *plVar16;
            local_270 = (long *)*plVar15;
          }
          local_268 = plVar15[1];
          *plVar15 = (long)plVar16;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_270,local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_290 != &local_280) {
            operator_delete(local_290,local_280 + 1);
          }
          if (local_238 != &local_228) {
            operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
          if ((bVar25) ||
             ((!bVar24 &&
              (bVar23 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                        ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                      *)(p_Var12 + 1),
                                     (Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1),b_00),
              !bVar23)))) {
            poVar3 = (ostringstream *)(local_1b8 + 8);
            local_1b8._0_8_ = pTVar8;
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
            tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3," exists for second case but not for first",0x29);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            poVar3 = (ostringstream *)(local_1b8 + 8);
            local_1b8._0_8_ = pTVar8;
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
            tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3," exists for first case but not for second",0x29);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          goto LAB_0077859a;
        }
        p_Var19 = (_Link_type)(p_Var13 + 1);
        bVar25 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                           ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1),
                            (Vector<tcu::Vector<float,_3>,_3> *)p_Var19);
        if (!bVar25) {
          bVar25 = false;
          bVar24 = false;
          goto LAB_00778100;
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while (((_Rb_tree_header *)p_Var12 != p_Var2) ||
              ((_Rb_tree_header *)p_Var13 != &local_218._M_t._M_impl.super__Rb_tree_header));
    }
  }
  else {
    if (TVar7 != TESSPRIMITIVETYPE_TRIANGLES) {
      return false;
    }
    pTVar8 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    local_248 = (long)(primitivesA->
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(primitivesA->
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    local_250 = (long)(primitivesB->
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(primitivesB->
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e8._M_t._M_impl._0_1_ = 0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_218._M_t._M_impl.super__Rb_tree_header._M_header;
    local_218._M_t._M_impl._0_1_ = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar23 = true;
    do {
      bVar25 = bVar23;
      uVar21 = local_250;
      if (bVar25) {
        uVar21 = local_248;
      }
      local_240 = &local_218;
      if (bVar25) {
        local_240 = &local_1e8;
      }
      uVar22 = (uint)(uVar21 >> 6);
      if (0 < (int)uVar22) {
        uVar21 = 0;
        do {
          pPVar10 = primitivesB;
          if (bVar25) {
            pPVar10 = primitivesA;
          }
          pPVar9 = (pPVar10->
                   super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)(pPVar9[uVar21].tessCoord[0].m_data + 1);
          pfVar1 = pPVar9[uVar21].tessCoord[1].m_data + 1;
          uVar6 = *(undefined8 *)pPVar9[uVar21].tessCoord[2].m_data;
          local_1b8._4_4_ = (int)uVar5;
          local_1b8._0_4_ = pPVar9[uVar21].tessCoord[0].m_data[0];
          local_1b8._8_4_ = (int)((ulong)uVar5 >> 0x20);
          local_1b8._12_4_ = pPVar9[uVar21].tessCoord[1].m_data[0];
          local_1a8 = *pfVar1;
          fStack_1a4 = pfVar1[1];
          uStack_1a0 = (int)uVar6;
          uStack_19c = (int)((ulong)uVar6 >> 0x20);
          local_198 = pPVar9[uVar21].tessCoord[2].m_data[2];
          uVar14 = 0;
          bVar23 = false;
          p_Var11 = (_Link_type)local_1b8;
          do {
            p_Var19 = (_Link_type)0x0;
            do {
              fVar4 = *(float *)((p_Var11->_M_storage)._M_storage + (long)p_Var19 * 4 + -0x20);
              if ((fVar4 == 0.0) && (!NAN(fVar4))) {
                if (bVar23) goto LAB_00777d5d;
                goto LAB_00777d7d;
              }
              p_Var19 = (_Link_type)((long)&(p_Var19->super__Rb_tree_node_base)._M_color + 1);
            } while (p_Var19 != (_Link_type)0x3);
            bVar23 = 1 < uVar14;
            uVar14 = uVar14 + 1;
            p_Var11 = (_Link_type)((long)&(p_Var11->super__Rb_tree_node_base)._M_parent + 4);
          } while (uVar14 != 3);
LAB_00777d5d:
          std::
          __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
                    ((_Link_type)local_1b8,local_1b8 + 0x24);
          p_Var19 = (_Link_type)local_1b8;
          std::
          set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
          ::insert(local_240,(value_type *)local_1b8);
LAB_00777d7d:
          uVar21 = uVar21 + 1;
        } while (uVar21 != (uVar22 & 0x7fffffff));
      }
      bVar23 = false;
    } while (bVar25);
    p_Var2 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
    bVar23 = true;
    p_Var12 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_218._M_t._M_impl.super__Rb_tree_header ||
        (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2)
    {
      do {
        p_Var17 = &local_218._M_t._M_impl.super__Rb_tree_header;
        bVar24 = (_Rb_tree_header *)p_Var13 == p_Var17;
        bVar25 = (_Rb_tree_header *)p_Var12 == p_Var2;
        if ((bVar25) || ((_Rb_tree_header *)p_Var13 == p_Var17)) {
LAB_0077807b:
          poVar3 = (ostringstream *)(local_1b8 + 8);
          local_1b8._0_8_ = pTVar8;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,
                     "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                     ,0x5a);
          local_238 = &local_228;
          local_230 = 0;
          local_228 = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_238);
          local_290 = &local_280;
          plVar16 = plVar15 + 2;
          if ((long *)*plVar15 == plVar16) {
            local_280 = *plVar16;
            lStack_278 = plVar15[3];
          }
          else {
            local_280 = *plVar16;
            local_290 = (long *)*plVar15;
          }
          local_288 = plVar15[1];
          *plVar15 = (long)plVar16;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_290);
          plVar16 = plVar15 + 2;
          if ((long *)*plVar15 == plVar16) {
            local_260 = *plVar16;
            lStack_258 = plVar15[3];
            local_270 = &local_260;
          }
          else {
            local_260 = *plVar16;
            local_270 = (long *)*plVar15;
          }
          local_268 = plVar15[1];
          *plVar15 = (long)plVar16;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_270,local_268);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_290 != &local_280) {
            operator_delete(local_290,local_280 + 1);
          }
          if (local_238 != &local_228) {
            operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
          if ((bVar25) ||
             ((!bVar24 &&
              (bVar23 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                        ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                      *)(p_Var12 + 1),
                                     (Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1),b), !bVar23))
             )) {
            poVar3 = (ostringstream *)(local_1b8 + 8);
            local_1b8._0_8_ = pTVar8;
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
            tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var13 + 1));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3," exists for second case but not for first",0x29);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            poVar3 = (ostringstream *)(local_1b8 + 8);
            local_1b8._0_8_ = pTVar8;
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
            tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3," exists for first case but not for second",0x29);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
LAB_0077859a:
          p_Var19 = (_Link_type)&std::__cxx11::ostringstream::VTT;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
          bVar23 = false;
          break;
        }
        p_Var19 = (_Link_type)(p_Var13 + 1);
        bVar25 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                           ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var12 + 1),
                            (Vector<tcu::Vector<float,_3>,_3> *)p_Var19);
        if (!bVar25) {
          bVar25 = false;
          bVar24 = false;
          goto LAB_0077807b;
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
      } while (((_Rb_tree_header *)p_Var12 != p_Var2) ||
              ((_Rb_tree_header *)p_Var13 != &local_218._M_t._M_impl.super__Rb_tree_header));
    }
  }
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var19);
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var19);
  return bVar23;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(), IsInnerTriangleTriangle(), "outer triangles");
		else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(), IsInnerQuadTriangle(), "outer triangles");
		else
		{
			DE_ASSERT(false);
			return false;
		}
	}